

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  uint uVar1;
  Expr *p;
  Vdbe *pVVar2;
  Index *pIVar3;
  WhereInfo *pWVar4;
  InLoop *__src;
  size_t __n;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ExprList_item *pEVar8;
  int iVar9;
  int iVar10;
  WhereMemBlock *pWVar11;
  long lVar12;
  Expr *pEVar13;
  ExprList *pEVar14;
  Select *pSVar15;
  u8 uVar16;
  ulong uVar17;
  WhereLoop *pWVar18;
  InLoop *pIVar19;
  WhereLevel *pWVar20;
  Expr *pExpr;
  uint uVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  int iVar44;
  int iVar47;
  undefined1 auVar45 [16];
  int iVar48;
  undefined1 auVar46 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar51 [16];
  int iTab;
  int local_94;
  sqlite3 *local_90;
  ExprList *local_88;
  Expr *local_80;
  ExprList *local_78;
  ExprList_item *local_70;
  ulong local_68;
  WhereLevel *local_60;
  WhereLoop *local_58;
  Vdbe *local_50;
  WhereTerm *local_48;
  ExprList *local_40;
  ExprList *local_38;
  
  p = pTerm->pExpr;
  uVar16 = p->op;
  if (uVar16 == '5') {
LAB_001a7e63:
    iTarget = sqlite3ExprCodeTarget(pParse,p->pRight,iTarget);
    goto LAB_001a8224;
  }
  pVVar2 = pParse->pVdbe;
  if (uVar16 == '2') {
    sqlite3VdbeAddOp3(pVVar2,0x4b,0,iTarget,0);
    goto LAB_001a8224;
  }
  if (uVar16 == '-') goto LAB_001a7e63;
  pWVar18 = pLevel->pWLoop;
  if ((((pWVar18->wsFlags & 0x400) == 0) &&
      (pIVar3 = (pWVar18->u).btree.pIndex, pIVar3 != (Index *)0x0)) &&
     (pIVar3->aSortOrder[iEq] != '\0')) {
    bRev = (int)(bRev == 0);
  }
  local_50 = pVVar2;
  if (0 < iEq) {
    uVar17 = 0;
    do {
      if ((pWVar18->aLTerm[uVar17] != (WhereTerm *)0x0) && (pWVar18->aLTerm[uVar17]->pExpr == p)) {
        disableTerm(pLevel,pTerm);
        return iTarget;
      }
      uVar17 = uVar17 + 1;
    } while ((uint)iEq != uVar17);
  }
  iVar9 = 0;
  if (iEq < (int)(uint)pWVar18->nLTerm) {
    uVar17 = (ulong)iEq;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (uint)(pWVar18->aLTerm[uVar17]->pExpr == p);
      uVar17 = uVar17 + 1;
    } while (pWVar18->nLTerm != uVar17);
  }
  local_94 = 0;
  local_68 = (ulong)iVar9;
  local_58 = pWVar18;
  local_48 = pTerm;
  if (((p->flags >> 0xc & 1) == 0) || (((p->x).pSelect)->pEList->nExpr == 1)) {
    local_88 = (ExprList *)0x0;
LAB_001a7f82:
    iVar9 = sqlite3FindInIndex(pParse,p,4,(int *)0x0,&local_88->nExpr,&local_94);
  }
  else {
    if (((p->flags >> 0x19 & 1) != 0) && (p->iTable != 0)) {
      pSVar15 = (Select *)p->pLeft;
      uVar16 = pSVar15->op;
      if (uVar16 == 0xb0) {
        uVar16 = (u8)pSVar15->nSelectRow;
      }
      if (uVar16 == 0xb1) {
LAB_001a8297:
        iVar44 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr;
      }
      else {
        iVar44 = 1;
        if (uVar16 == 0x8a) {
          pSVar15 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pSelect;
          goto LAB_001a8297;
        }
      }
      if (iVar44 < iVar9) {
        iVar44 = iVar9;
      }
      local_88 = (ExprList *)sqlite3DbMallocZero(pParse->db,(long)iVar44 << 2);
      goto LAB_001a7f82;
    }
    local_90 = pParse->db;
    local_88 = (ExprList *)0x0;
    pEVar13 = exprDup(local_90,p,0,(u8 **)0x0);
    iVar9 = 5;
    if (local_90->mallocFailed == '\0') {
      local_40 = ((pEVar13->x).pSelect)->pEList;
      local_38 = (pEVar13->pLeft->x).pList;
      uVar17 = (ulong)pWVar18->nLTerm;
      local_80 = pEVar13;
      if (iEq < (int)(uint)pWVar18->nLTerm) {
        pWVar20 = (WhereLevel *)local_40->a;
        local_70 = local_38->a;
        lVar22 = (long)iEq;
        local_78 = (ExprList *)0x0;
        pEVar14 = (ExprList *)0x0;
        local_60 = pWVar20;
        do {
          if (pWVar18->aLTerm[lVar22]->pExpr == p) {
            lVar23 = (long)(pWVar18->aLTerm[lVar22]->u).x.iField + -1;
            pEVar13 = ((ExprList_item *)((long)pWVar20 + lVar23 * 0x18))->pExpr;
            if (pEVar13 != (Expr *)0x0) {
              local_88 = pEVar14;
              local_78 = sqlite3ExprListAppend(pParse,local_78,pEVar13);
              pEVar8 = local_70;
              ((ExprList_item *)((long)pWVar20 + lVar23 * 0x18))->pExpr = (Expr *)0x0;
              pEVar14 = sqlite3ExprListAppend(pParse,local_88,local_70[lVar23].pExpr);
              pEVar8[lVar23].pExpr = (Expr *)0x0;
              uVar17 = (ulong)local_58->nLTerm;
              pWVar20 = local_60;
              pWVar18 = local_58;
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < (long)uVar17);
      }
      else {
        pEVar14 = (ExprList *)0x0;
        local_78 = (ExprList *)0x0;
      }
      if (local_40 != (ExprList *)0x0) {
        exprListDeleteNN(local_90,local_40);
      }
      pTerm = local_48;
      if (local_38 != (ExprList *)0x0) {
        exprListDeleteNN(local_90,local_38);
      }
      (local_80->pLeft->x).pList = pEVar14;
      ((local_80->x).pSelect)->pEList = local_78;
      if ((pEVar14 != (ExprList *)0x0) && (pEVar14->nExpr == 1)) {
        pEVar13 = pEVar14->a[0].pExpr;
        pEVar14->a[0].pExpr = (Expr *)0x0;
        if (local_80->pLeft != (Expr *)0x0) {
          sqlite3ExprDeleteNN(local_90,local_80->pLeft);
        }
        local_80->pLeft = pEVar13;
      }
      auVar7 = _DAT_001e3de0;
      pEVar14 = ((local_80->x).pSelect)->pOrderBy;
      if (pEVar14 != (ExprList *)0x0) {
        iVar9 = pEVar14->nExpr;
        if (0 < (long)iVar9) {
          lVar22 = (long)iVar9 + -1;
          auVar24._8_4_ = (int)lVar22;
          auVar24._0_8_ = lVar22;
          auVar24._12_4_ = (int)((ulong)lVar22 >> 0x20);
          lVar22 = 0;
          auVar24 = auVar24 ^ _DAT_001e3de0;
          auVar26 = _DAT_001e3df0;
          auVar27 = _DAT_001e3e00;
          auVar28 = _DAT_001e3dc0;
          auVar29 = _DAT_001e3dd0;
          do {
            auVar30 = auVar29 ^ auVar7;
            iVar44 = auVar24._0_4_;
            iVar43 = -(uint)(iVar44 < auVar30._0_4_);
            iVar10 = auVar24._4_4_;
            auVar31._4_4_ = -(uint)(iVar10 < auVar30._4_4_);
            iVar48 = auVar24._8_4_;
            iVar47 = -(uint)(iVar48 < auVar30._8_4_);
            iVar25 = auVar24._12_4_;
            auVar31._12_4_ = -(uint)(iVar25 < auVar30._12_4_);
            auVar40._4_4_ = iVar43;
            auVar40._0_4_ = iVar43;
            auVar40._8_4_ = iVar47;
            auVar40._12_4_ = iVar47;
            auVar49 = pshuflw(in_XMM11,auVar40,0xe8);
            auVar33._4_4_ = -(uint)(auVar30._4_4_ == iVar10);
            auVar33._12_4_ = -(uint)(auVar30._12_4_ == iVar25);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar51 = pshuflw(in_XMM12,auVar33,0xe8);
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            auVar50 = pshuflw(auVar49,auVar31,0xe8);
            auVar30._8_4_ = 0xffffffff;
            auVar30._0_8_ = 0xffffffffffffffff;
            auVar30._12_4_ = 0xffffffff;
            auVar30 = (auVar50 | auVar51 & auVar49) ^ auVar30;
            auVar30 = packssdw(auVar30,auVar30);
            if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar14->a[0].u + lVar22) = 0;
            }
            auVar31 = auVar33 & auVar40 | auVar31;
            auVar30 = packssdw(auVar31,auVar31);
            auVar50._8_4_ = 0xffffffff;
            auVar50._0_8_ = 0xffffffffffffffff;
            auVar50._12_4_ = 0xffffffff;
            auVar30 = packssdw(auVar30 ^ auVar50,auVar30 ^ auVar50);
            if ((auVar30._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)&pEVar14[1].a[0].zEName + lVar22 + 4) = 0;
            }
            auVar30 = auVar28 ^ auVar7;
            iVar43 = -(uint)(iVar44 < auVar30._0_4_);
            auVar45._4_4_ = -(uint)(iVar10 < auVar30._4_4_);
            iVar47 = -(uint)(iVar48 < auVar30._8_4_);
            auVar45._12_4_ = -(uint)(iVar25 < auVar30._12_4_);
            auVar32._4_4_ = iVar43;
            auVar32._0_4_ = iVar43;
            auVar32._8_4_ = iVar47;
            auVar32._12_4_ = iVar47;
            auVar39._4_4_ = -(uint)(auVar30._4_4_ == iVar10);
            auVar39._12_4_ = -(uint)(auVar30._12_4_ == iVar25);
            auVar39._0_4_ = auVar39._4_4_;
            auVar39._8_4_ = auVar39._12_4_;
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar30 = auVar39 & auVar32 | auVar45;
            auVar30 = packssdw(auVar30,auVar30);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar30 = packssdw(auVar30 ^ auVar5,auVar30 ^ auVar5);
            if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar14[2].a[0].pExpr + lVar22 + 4) = 0;
            }
            auVar33 = pshufhw(auVar32,auVar32,0x84);
            auVar40 = pshufhw(auVar39,auVar39,0x84);
            auVar31 = pshufhw(auVar33,auVar45,0x84);
            auVar34._8_4_ = 0xffffffff;
            auVar34._0_8_ = 0xffffffffffffffff;
            auVar34._12_4_ = 0xffffffff;
            auVar34 = (auVar31 | auVar40 & auVar33) ^ auVar34;
            auVar33 = packssdw(auVar34,auVar34);
            if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pEVar14[3].a + lVar22 + -4) = 0;
            }
            auVar33 = auVar27 ^ auVar7;
            iVar43 = -(uint)(iVar44 < auVar33._0_4_);
            auVar36._4_4_ = -(uint)(iVar10 < auVar33._4_4_);
            iVar47 = -(uint)(iVar48 < auVar33._8_4_);
            auVar36._12_4_ = -(uint)(iVar25 < auVar33._12_4_);
            auVar41._4_4_ = iVar43;
            auVar41._0_4_ = iVar43;
            auVar41._8_4_ = iVar47;
            auVar41._12_4_ = iVar47;
            auVar30 = pshuflw(auVar30,auVar41,0xe8);
            auVar35._4_4_ = -(uint)(auVar33._4_4_ == iVar10);
            auVar35._12_4_ = -(uint)(auVar33._12_4_ == iVar25);
            auVar35._0_4_ = auVar35._4_4_;
            auVar35._8_4_ = auVar35._12_4_;
            in_XMM12 = pshuflw(auVar51 & auVar49,auVar35,0xe8);
            in_XMM12 = in_XMM12 & auVar30;
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar30 = pshuflw(auVar30,auVar36,0xe8);
            auVar49._8_4_ = 0xffffffff;
            auVar49._0_8_ = 0xffffffffffffffff;
            auVar49._12_4_ = 0xffffffff;
            auVar49 = (auVar30 | in_XMM12) ^ auVar49;
            auVar30 = packssdw(auVar49,auVar49);
            if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar14[3].a[0].u + lVar22) = 0;
            }
            auVar36 = auVar35 & auVar41 | auVar36;
            auVar30 = packssdw(auVar36,auVar36);
            auVar51._8_4_ = 0xffffffff;
            auVar51._0_8_ = 0xffffffffffffffff;
            auVar51._12_4_ = 0xffffffff;
            auVar30 = packssdw(auVar30 ^ auVar51,auVar30 ^ auVar51);
            if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar14[4].a[0].zEName + lVar22 + 4) = 0;
            }
            auVar30 = auVar26 ^ auVar7;
            iVar44 = -(uint)(iVar44 < auVar30._0_4_);
            auVar46._4_4_ = -(uint)(iVar10 < auVar30._4_4_);
            iVar48 = -(uint)(iVar48 < auVar30._8_4_);
            auVar46._12_4_ = -(uint)(iVar25 < auVar30._12_4_);
            auVar37._4_4_ = iVar44;
            auVar37._0_4_ = iVar44;
            auVar37._8_4_ = iVar48;
            auVar37._12_4_ = iVar48;
            auVar42._4_4_ = -(uint)(auVar30._4_4_ == iVar10);
            auVar42._12_4_ = -(uint)(auVar30._12_4_ == iVar25);
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar30 = auVar42 & auVar37 | auVar46;
            auVar30 = packssdw(auVar30,auVar30);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            in_XMM11 = packssdw(auVar30 ^ auVar6,auVar30 ^ auVar6);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pEVar14[5].a[0].pExpr + lVar22 + 4) = 0;
            }
            auVar30 = pshufhw(auVar37,auVar37,0x84);
            auVar31 = pshufhw(auVar42,auVar42,0x84);
            auVar33 = pshufhw(auVar30,auVar46,0x84);
            auVar38._8_4_ = 0xffffffff;
            auVar38._0_8_ = 0xffffffffffffffff;
            auVar38._12_4_ = 0xffffffff;
            auVar38 = (auVar33 | auVar31 & auVar30) ^ auVar38;
            auVar30 = packssdw(auVar38,auVar38);
            if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pEVar14[6].a + lVar22 + -4) = 0;
            }
            lVar23 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 8;
            auVar29._8_8_ = lVar23 + 8;
            lVar23 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 8;
            auVar28._8_8_ = lVar23 + 8;
            lVar23 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 8;
            auVar27._8_8_ = lVar23 + 8;
            lVar23 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 8;
            auVar26._8_8_ = lVar23 + 8;
            lVar22 = lVar22 + 0xc0;
          } while ((ulong)(iVar9 + 7U >> 3) * 0xc0 != lVar22);
        }
      }
      if (local_90->mallocFailed == '\0') {
        local_88 = (ExprList *)sqlite3DbMallocZero(pParse->db,local_68 * 4);
        pEVar13 = local_80;
        iVar9 = sqlite3FindInIndex(pParse,local_80,4,(int *)0x0,(int *)local_88,&local_94);
        p->iTable = local_94;
      }
      else {
        local_88 = (ExprList *)0x0;
        iVar9 = 5;
        pEVar13 = local_80;
      }
    }
    if (pEVar13 != (Expr *)0x0) {
      sqlite3ExprDeleteNN(local_90,pEVar13);
    }
  }
  iVar44 = local_94;
  local_78 = (ExprList *)CONCAT44(local_78._4_4_,iVar9);
  uVar21 = (uint)(bRev == 0);
  if (iVar9 != 4) {
    uVar21 = bRev;
  }
  sqlite3VdbeAddOp3(local_50,(uint)(uVar21 == 0) * 4 + 0x20,local_94,0,0);
  uVar1 = pWVar18->wsFlags;
  pWVar18->wsFlags = uVar1 | 0x800;
  if ((pLevel->u).in.nIn == 0) {
    iVar9 = pParse->nLabel + -1;
    pParse->nLabel = iVar9;
    pLevel->addrNxt = iVar9;
  }
  if ((0 < iEq) && ((uVar1 & 0x100000) == 0)) {
    pWVar18->wsFlags = uVar1 | 0x40800;
  }
  local_70 = (ExprList_item *)(long)(pLevel->u).in.nIn;
  lVar22 = (long)&local_70->pExpr + local_68;
  (pLevel->u).in.nIn = (int)lVar22;
  pWVar4 = pTerm->pWC->pWInfo;
  __src = (pLevel->u).in.aInLoop;
  local_90 = (sqlite3 *)pParse;
  pWVar11 = (WhereMemBlock *)sqlite3DbMallocRawNN(pWVar4->pParse->db,lVar22 * 0x14 + 0x10);
  if (pWVar11 == (WhereMemBlock *)0x0) {
    (pLevel->u).in.aInLoop = (InLoop *)0x0;
    (pLevel->u).in.nIn = 0;
  }
  else {
    pWVar11->pNext = pWVar4->pMemToFree;
    pWVar11->sz = lVar22 * 0x14;
    pWVar4->pMemToFree = pWVar11;
    pIVar19 = (InLoop *)(pWVar11 + 1);
    local_60 = pLevel;
    if (__src != (InLoop *)0x0) {
      __n._0_4_ = __src[-1].nPrefix;
      __n._4_1_ = __src[-1].eEndLoopOp;
      __n._5_3_ = *(undefined3 *)&__src[-1].field_0x11;
      memcpy(pIVar19,__src,__n);
    }
    (local_60->u).in.aInLoop = pIVar19;
    uVar17 = (ulong)local_58->nLTerm;
    pWVar18 = local_58;
    if (iEq < (int)(uint)local_58->nLTerm) {
      pIVar19 = pIVar19 + (long)local_70;
      local_70 = (ExprList_item *)(CONCAT71(local_70._1_7_,uVar21 == 0) | 0x26);
      lVar23 = (long)iEq;
      local_80 = (Expr *)CONCAT44(local_80._4_4_,iTarget - iEq);
      lVar22 = 0;
      local_68 = local_68 & 0xffffffff00000000;
      iVar9 = iTarget;
      do {
        pVVar2 = local_50;
        if (pWVar18->aLTerm[lVar23]->pExpr == p) {
          if ((int)local_78 == 1) {
            iVar25 = 0x87;
            iVar10 = iVar9;
            iVar48 = 0;
          }
          else {
            if (local_88 == (ExprList *)0x0) {
              iVar10 = 0;
            }
            else {
              lVar12 = (long)(int)local_68;
              local_68 = CONCAT44(local_68._4_4_,(int)local_68 + 1);
              iVar10 = *(int *)((long)local_88->a + lVar12 * 4 + -8);
            }
            iVar25 = 0x5e;
            iVar48 = iVar9;
          }
          iVar10 = sqlite3VdbeAddOp3(local_50,iVar25,iVar44,iVar10,iVar48);
          pIVar19->addrInTop = iVar10;
          sqlite3VdbeAddOp3(pVVar2,0x32,iVar9,0,0);
          if (lVar22 == 0) {
            pIVar19->iCur = iVar44;
            pIVar19->eEndLoopOp = (u8)local_70;
            if (iEq < 1) {
              pIVar19->nPrefix = 0;
            }
            else {
              pIVar19->iBase = (int)local_80;
              pIVar19->nPrefix = iEq;
            }
          }
          else {
            pIVar19->eEndLoopOp = 0xb8;
          }
          pIVar19 = pIVar19 + 1;
          uVar17 = (ulong)local_58->nLTerm;
          pWVar18 = local_58;
        }
        lVar23 = lVar23 + 1;
        lVar22 = lVar22 + -1;
        iVar9 = iVar9 + 1;
      } while (lVar23 < (long)uVar17);
    }
    pLevel = local_60;
    if ((0 < iEq) && ((pWVar18->wsFlags & 0x100400) == 0)) {
      sqlite3VdbeAddOp3(local_50,0x7d,local_60->iIdxCur,0,iEq);
    }
  }
  pTerm = local_48;
  if (local_88 != (ExprList *)0x0) {
    sqlite3DbFreeNN((sqlite3 *)local_90->pVfs,local_88);
  }
LAB_001a8224:
  if (((pLevel->pWLoop->wsFlags & 0x200000) == 0) || ((pTerm->eOperator & 0x800) == 0)) {
    disableTerm(pLevel,pTerm);
  }
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    iTab = 0;
    if( !ExprUseXSelect(pX) || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
    }else{
      Expr *pExpr = pTerm->pExpr;
      if( pExpr->iTable==0 || !ExprHasProperty(pExpr, EP_Subrtn) ){
        sqlite3 *db = pParse->db;
        pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);
        if( !db->mallocFailed ){
          aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
          eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap,&iTab);
          pExpr->iTable = iTab;
        }
        sqlite3ExprDelete(db, pX);
      }else{
        int n = sqlite3ExprVectorSize(pX->pLeft);
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*MAX(nEq,n));
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
      }
      pX = pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);

    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
    }
    if( iEq>0 && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0 ){
      pLoop->wsFlags |= WHERE_IN_EARLYOUT;
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3WhereRealloc(pTerm->pWC->pWInfo,
                           pLevel->u.in.aInLoop,
                           sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
      testcase( iEq>0
                && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0
                && (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 );
      if( iEq>0
       && (pLoop->wsFlags & (WHERE_IN_SEEKSCAN|WHERE_VIRTUALTABLE))==0
      ){
        sqlite3VdbeAddOp3(v, OP_SeekHit, pLevel->iIdxCur, 0, iEq);
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }

  /* As an optimization, try to disable the WHERE clause term that is
  ** driving the index as it will always be true.  The correct answer is
  ** obtained regardless, but we might get the answer with fewer CPU cycles
  ** by omitting the term.
  **
  ** But do not disable the term unless we are certain that the term is
  ** not a transitive constraint.  For an example of where that does not
  ** work, see https://sqlite.org/forum/forumpost/eb8613976a (2021-05-04)
  */
  if( (pLevel->pWLoop->wsFlags & WHERE_TRANSCONS)==0
   || (pTerm->eOperator & WO_EQUIV)==0
  ){
    disableTerm(pLevel, pTerm);
  }

  return iReg;
}